

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O3

int Mvc_CoverSetCubeSizes(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  long lVar2;
  uint uVar3;
  Mvc_CubeWord_t *pMVar4;
  
  pMVar1 = (pCover->lCubes).pHead;
  if (pMVar1 != (Mvc_Cube_t *)0x0) {
    lVar2 = (long)(int)(((int)((ulong)(long)pCover->nBits >> 3) + 1) -
                       (uint)((pCover->nBits & 7U) == 0));
    do {
      if (lVar2 < 1) {
        uVar3 = 0;
      }
      else {
        pMVar4 = pMVar1->pData;
        uVar3 = 0;
        do {
          uVar3 = uVar3 + bit_count[(byte)*pMVar4];
          pMVar4 = (Mvc_CubeWord_t *)((long)pMVar4 + 1);
        } while (pMVar4 < (byte *)((long)pMVar1->pData + lVar2));
      }
      pMVar1->nOnes = uVar3;
      pMVar1 = pMVar1->pNext;
    } while (pMVar1 != (Mvc_Cube_t *)0x0);
  }
  return 1;
}

Assistant:

int Mvc_CoverSetCubeSizes( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    unsigned char * pByte, * pByteStart, * pByteStop;
    int nBytes, nOnes;

    // get the number of unsigned chars in the cube's bit strings
    nBytes = pCover->nBits / (8 * sizeof(unsigned char)) + (int)(pCover->nBits % (8 * sizeof(unsigned char)) > 0);
    // iterate through the cubes
    Mvc_CoverForEachCube( pCover, pCube )
    {
        // clean the counter of ones
        nOnes = 0;
        // set the starting and stopping positions
        pByteStart = (unsigned char *)pCube->pData;
        pByteStop  = pByteStart + nBytes;
        // iterate through the positions
        for ( pByte = pByteStart; pByte < pByteStop; pByte++ )
            nOnes += bit_count[*pByte];
        // set the nOnes
        Mvc_CubeSetSize( pCube, nOnes );
    }
    return 1;
}